

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

art_erase_result_t art_erase_at(art_node_t *node,art_key_chunk_t *key,uint8_t depth)

{
  art_node_t aVar1;
  art_key_chunk_t key_chunk;
  uint8_t offset;
  art_node_t *node_00;
  art_node_t *new_child;
  art_node_t aVar2;
  ulong uVar3;
  long lVar4;
  art_val_t *paVar5;
  art_erase_result_t aVar6;
  
  if (((ulong)node & 1) == 0) {
    aVar1 = node[1];
    aVar2 = (art_node_t)(6 - depth);
    if ((byte)aVar1 <= (byte)(6 - depth)) {
      aVar2 = aVar1;
    }
    if (aVar2 == (art_node_t)0x0) {
      aVar2 = (art_node_t)0x0;
    }
    else {
      uVar3 = 0;
      do {
        if (node[uVar3 + 2] != *(art_node_t *)(key + uVar3 + depth)) {
          aVar2 = SUB81(uVar3,0);
          break;
        }
        uVar3 = uVar3 + 1;
      } while ((byte)aVar2 != uVar3);
    }
    if (aVar2 == aVar1) {
      lVar4 = (ulong)depth + (ulong)(byte)aVar1;
      key_chunk = key[lVar4];
      node_00 = art_find_child((art_inner_node_t *)node,key_chunk);
      if (node_00 != (art_node_t *)0x0) {
        aVar6 = art_erase_at(node_00,key,(char)lVar4 + '\x01');
        paVar5 = aVar6.value_erased;
        new_child = aVar6.rootmost_node;
        if (paVar5 != (art_val_t *)0x0) {
          if (new_child == (art_node_t *)0x0) {
            node = art_node_erase((art_inner_node_t *)node,key_chunk);
          }
          else if (new_child != node_00) {
            art_replace((art_inner_node_t *)node,key_chunk,new_child);
          }
          goto LAB_0010d3e0;
        }
      }
    }
LAB_0010d3db:
    node = (art_node_t *)0x0;
    paVar5 = (art_val_t *)0x0;
  }
  else {
    paVar5 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
    lVar4 = 0;
    do {
      if (paVar5->key[lVar4] != key[lVar4]) {
        if (lVar4 != 6) goto LAB_0010d3db;
        break;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    node = (art_node_t *)0x0;
  }
LAB_0010d3e0:
  aVar6.value_erased = paVar5;
  aVar6.rootmost_node = node;
  return aVar6;
}

Assistant:

static art_erase_result_t art_erase_at(art_node_t *node,
                                       const art_key_chunk_t *key,
                                       uint8_t depth) {
    art_erase_result_t result;
    result.rootmost_node = NULL;
    result.value_erased = NULL;

    if (art_is_leaf(node)) {
        art_leaf_t *leaf = CAST_LEAF(node);
        uint8_t common_prefix = art_common_prefix(leaf->key, 0, ART_KEY_BYTES,
                                                  key, 0, ART_KEY_BYTES);
        if (common_prefix != ART_KEY_BYTES) {
            // Leaf key mismatch.
            return result;
        }
        result.value_erased = (art_val_t *)leaf;
        return result;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)node;
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Prefix mismatch.
        return result;
    }
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_node_t *child = art_find_child(inner_node, key_chunk);
    if (child == NULL) {
        // No child with key chunk.
        return result;
    }
    // Try to erase the key further down. Skip the key chunk associated with the
    // child in the node.
    art_erase_result_t child_result =
        art_erase_at(child, key, depth + common_prefix + 1);
    if (child_result.value_erased == NULL) {
        return result;
    }
    result.value_erased = child_result.value_erased;
    result.rootmost_node = node;
    if (child_result.rootmost_node == NULL) {
        // Child node was fully erased, erase it from this node's children.
        result.rootmost_node = art_node_erase(inner_node, key_chunk);
    } else if (child_result.rootmost_node != child) {
        // Child node was not fully erased, update the pointer to it in this
        // node.
        art_replace(inner_node, key_chunk, child_result.rootmost_node);
    }
    return result;
}